

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O2

void for_each_word_enum_cb(void *ctx0,CVmHashEntry *entry0)

{
  vm_prop_id_t vVar1;
  vm_obj_id_t vVar2;
  _func_int **pp_Var3;
  vm_datatype_t *pvVar4;
  vm_val_t *pvVar5;
  vm_obj_id_t vVar6;
  CVmHashEntry *pCVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar9 = 0;
  vVar6 = CVmObjString::create(0,entry0->str_,entry0->len_);
  while( true ) {
    pvVar5 = sp_;
    uVar8 = 0;
    pCVar7 = entry0 + 1;
    while ((pp_Var3 = pCVar7->_vptr_CVmHashEntry, uVar8 < uVar9 && (pp_Var3 != (_func_int **)0x0)))
    {
      uVar8 = uVar8 + 1;
      pCVar7 = (CVmHashEntry *)(pp_Var3 + 1);
    }
    if (pp_Var3 == (_func_int **)0x0) break;
    vVar1 = *(vm_prop_id_t *)((long)pp_Var3 + 4);
    pvVar4 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar4 = VM_PROP;
    (pvVar5->val).prop = vVar1;
    pvVar5 = sp_;
    pvVar4 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar4 = VM_OBJ;
    (pvVar5->val).obj = vVar6;
    pvVar5 = sp_;
    vVar2 = *(vm_obj_id_t *)pp_Var3;
    pvVar4 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar4 = VM_OBJ;
    (pvVar5->val).obj = vVar2;
    CVmRun::call_func_ptr(&G_interpreter_X,*ctx0,3,(vm_rcdesc *)((long)ctx0 + 0x10),0);
    uVar9 = uVar9 + 1;
  }
  return;
}

Assistant:

static void for_each_word_enum_cb(void *ctx0, CVmHashEntry *entry0)
{
    for_each_word_enum_cb_ctx *ctx = (for_each_word_enum_cb_ctx *)ctx0;
    CVmHashEntryDict *entry = (CVmHashEntryDict *)entry0;
    size_t list_idx;
    vm_obj_id_t str_obj;

    /* set up access to the VM globals through my stashed context */
    VMGLOB_PTR(ctx->vmg);

    /* create a string object for this entry's word string */
    str_obj = CVmObjString::create(vmg_ FALSE,
                                   entry->getstr(), entry->getlen());

    /* scan the entry's list of word associations */
    for (list_idx = 0 ; ; ++list_idx)
    {
        vm_dict_entry *p;
        size_t i;

        /*
         *   Find the list entry at the current list index.  Note that we
         *   scan the list on each iteration for the current index because
         *   we don't want to keep track of any pointers between iterations;
         *   this insulates us from any changes to the underlying list made
         *   in the callback.  
         */
        for (i = 0, p = entry->get_head() ; i < list_idx && p != 0 ;
             p = p->nxt_, ++i) ;

        /* 
         *   if we didn't find a list entry at this index, we're done with
         *   this hashtable entry 
         */
        if (p == 0)
            break;

        /* 
         *   Invoke the callback on this list entry.  The arguments to the
         *   callback are the object, the string, and the vocabulary
         *   property of the association:
         *   
         *   func(obj, str, prop)
         *   
         *   Note that the order of the arguments is the same as for
         *   addWord() and removeWord().  
         */

        /* push the vocabulary property of the association */
        G_stk->push()->set_propid(p->prop_);

        /* push the string of the entry */
        G_stk->push()->set_obj(str_obj);

        /* push the object of the association */
        G_stk->push()->set_obj(p->obj_);

        /* invoke the callback */
        G_interpreter->call_func_ptr(vmg_ ctx->cb_val, 3, &ctx->rc, 0);
    }
}